

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O1

QScroller * QScroller::scroller(QObject *target)

{
  bool bVar1;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_allScrollers>_> *this;
  Type *pTVar2;
  QScroller *pQVar3;
  QScroller *this_00;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_allScrollers>_> *in_RDI;
  long in_FS_OFFSET;
  QScroller *s;
  QScroller *local_30;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_allScrollers>_> *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_allScrollers>_>
                 *)0x0) {
    scroller();
    pQVar3 = (QScroller *)0x0;
  }
  else {
    local_28 = in_RDI;
    this = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_allScrollers>_> *)
           QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_allScrollers>_>::
           operator()(in_RDI);
    bVar1 = QMap<QObject_*,_QScroller_*>::contains
                      ((QMap<QObject_*,_QScroller_*> *)this,(QObject **)&local_28);
    if (bVar1) {
      pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_allScrollers>_>
               ::operator()(this);
      local_30 = (QScroller *)0x0;
      pQVar3 = QMap<QObject_*,_QScroller_*>::value(pTVar2,(QObject **)&local_28,&local_30);
    }
    else {
      this_00 = (QScroller *)operator_new(0x18);
      pQVar3 = this_00;
      QScroller(this_00,(QObject *)local_28);
      local_30 = this_00;
      pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_allScrollers>_>
               ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_allScrollers>_>
                             *)pQVar3);
      QMap<QObject_*,_QScroller_*>::insert(pTVar2,(QObject **)&local_28,&local_30);
      pQVar3 = local_30;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QScroller *QScroller::scroller(QObject *target)
{
    if (!target) {
        qWarning("QScroller::scroller() was called with a null target.");
        return nullptr;
    }

    if (qt_allScrollers()->contains(target))
        return qt_allScrollers()->value(target);

    QScroller *s = new QScroller(target);
    qt_allScrollers()->insert(target, s);
    return s;
}